

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOffsets
          (MessageGenerator *this,Printer *p)

{
  Options *opts;
  int iVar1;
  int iVar2;
  anon_unknown_0 *this_00;
  int *piVar3;
  bool bVar4;
  value_type_conflict this_01;
  OneofDescriptor *pOVar5;
  value_type pOVar6;
  string *psVar7;
  pointer piVar8;
  undefined1 split;
  Options *in_RCX;
  unsigned_long uVar9;
  pointer piVar10;
  FieldDescriptor *field;
  AlphaNum *a;
  ulong uVar11;
  unsigned_long uVar12;
  int v1;
  char *pcVar13;
  int *piVar14;
  pair<unsigned_long,_unsigned_long> pVar15;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  Formatter format;
  Iterator __begin3_1;
  Iterator __end3_1;
  string index_1;
  Iterator __begin3;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O2__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O2__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Iterator __end3;
  undefined1 local_220 [40];
  AlphaNum local_1f8;
  char *local_1c8;
  string_view local_1c0;
  undefined1 local_190 [40];
  Descriptor *local_168;
  string local_160;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O2__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  local_140;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O2__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  local_128;
  Iterator local_110;
  Options local_100;
  
  this_00 = (anon_unknown_0 *)this->descriptor_;
  opts = &this->options_;
  Options::Options(&local_100,opts);
  anon_unknown_0::ClassVars
            ((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
              *)&local_1f8,this_00,(Descriptor *)&local_100,in_RCX);
  vars.len_ = (long)((long)local_1f8.piece_._M_str - local_1f8.piece_._M_len) / 0xb8;
  vars.ptr_ = (pointer)local_1f8.piece_._M_len;
  io::Printer::WithVars(&local_128,p,vars);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)&local_1f8);
  Options::~Options(&local_100);
  MakeTrackerCalls((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                    *)&local_1f8,this->descriptor_,opts);
  vars_00.len_ = (long)((long)local_1f8.piece_._M_str - local_1f8.piece_._M_len) / 0xb8;
  vars_00.ptr_ = (pointer)local_1f8.piece_._M_len;
  io::Printer::WithVars(&local_140,p,vars_00);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)&local_1f8);
  local_220._8_8_ = 0;
  local_220._16_8_ = 0;
  local_220._24_8_ = google::protobuf::internal::TypeCardToString_abi_cxx11_;
  if (((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x53) != '\x01')) {
    pcVar13 = "~0u,  // no _has_bits_\n";
  }
  else {
    pcVar13 = "PROTOBUF_FIELD_OFFSET($classtype$, $has_bits$),\n";
  }
  local_220._0_8_ = p;
  Formatter::operator()<>((Formatter *)local_220,pcVar13);
  Formatter::operator()<>
            ((Formatter *)local_220,"PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_),\n");
  pcVar13 = "~0u,  // no _extensions_\n";
  if (0 < *(int *)(this->descriptor_ + 0x88)) {
    pcVar13 = "PROTOBUF_FIELD_OFFSET($classtype$, $extensions$),\n";
  }
  Formatter::operator()<>((Formatter *)local_220,pcVar13);
  pcVar13 = "~0u,  // no _oneof_case_\n";
  if (0 < *(int *)(this->descriptor_ + 0x7c)) {
    pcVar13 = "PROTOBUF_FIELD_OFFSET($classtype$, $oneof_case$[0]),\n";
  }
  Formatter::operator()<>((Formatter *)local_220,pcVar13);
  pcVar13 = "~0u,  // no _weak_field_map_\n";
  if (0 < this->num_weak_fields_) {
    pcVar13 = "PROTOBUF_FIELD_OFFSET($classtype$, $weak_field_map$),\n";
  }
  Formatter::operator()<>((Formatter *)local_220,pcVar13);
  pcVar13 = "PROTOBUF_FIELD_OFFSET($classtype$, $inlined_string_donated_array$),\n";
  if ((this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar13 = "~0u,  // no _inlined_string_donated_\n";
  }
  Formatter::operator()<>((Formatter *)local_220,pcVar13);
  bVar4 = ShouldSplit(this->descriptor_,opts);
  pcVar13 = "~0u,  // no _split_\n~0u,  // no sizeof(Split)\n";
  if (bVar4) {
    pcVar13 = "PROTOBUF_FIELD_OFFSET($classtype$, $split$),\nsizeof($classtype$::Impl_::Split),\n";
  }
  Formatter::operator()<>((Formatter *)local_220,pcVar13);
  local_168 = this->descriptor_;
  iVar1 = *(int *)(local_168 + 4);
  iVar2 = *(int *)(local_168 + 0x7c);
  uVar9 = (long)iVar1 + (long)iVar2 + 8;
  local_190._32_4_ = 0;
  local_110.idx = *(int *)(local_168 + 4);
  local_110.descriptor = local_168;
  do {
    bVar4 = protobuf::internal::operator!=((Iterator *)(local_190 + 0x20),&local_110);
    if (!bVar4) {
      local_1f8.piece_._M_str = (char *)this->descriptor_;
      local_1f8.piece_._M_len = local_1f8.piece_._M_len & 0xffffffff00000000;
      local_1c0._M_len._0_4_ = *(undefined4 *)((Descriptor *)local_1f8.piece_._M_str + 0x7c);
      local_1c0._M_str = local_1f8.piece_._M_str;
      v1 = 0;
      while (bVar4 = cpp::operator!=((Iterator *)&local_1f8,(Iterator *)&local_1c0), bVar4) {
        pOVar6 = OneOfRangeImpl::Iterator::operator*((Iterator *)&local_1f8);
        Formatter::operator()
                  ((Formatter *)local_220,"PROTOBUF_FIELD_OFFSET($classtype$, _impl_.$1$_),\n",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (pOVar6 + 8));
        v1 = v1 + 1;
        local_1f8.piece_._M_len =
             CONCAT44(local_1f8.piece_._M_len._4_4_,(int)local_1f8.piece_._M_len + 1);
      }
      psVar7 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                         (v1,*(int *)(this->descriptor_ + 0x7c),
                          "count == descriptor_->real_oneof_decl_count()");
      if (psVar7 != (string *)0x0) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1f8,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                   ,0xa15,psVar7->_M_string_length,(psVar7->_M_dataplus)._M_p);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_1f8);
      }
      if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x53) == '\x01') {
        Formatter::operator()<>((Formatter *)local_220,"0,\n1,\n");
        uVar12 = (long)iVar1 + (long)iVar2 + 10;
      }
      else {
        piVar8 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar10 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        uVar12 = uVar9;
        if (piVar8 != piVar10) {
          uVar12 = ((long)piVar10 - (long)piVar8 >> 2) + uVar9;
          for (uVar11 = 0; uVar11 < (ulong)((long)piVar10 - (long)piVar8 >> 2); uVar11 = uVar11 + 1)
          {
            if (piVar8[uVar11] < 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1c0,"~0u",(allocator<char> *)local_190);
            }
            else {
              absl::lts_20240722::AlphaNum::AlphaNum(&local_1f8,piVar8[uVar11]);
              absl::lts_20240722::StrCat_abi_cxx11_
                        ((string *)&local_1c0,(lts_20240722 *)&local_1f8,a);
            }
            Formatter::operator()((Formatter *)local_220,"$1$,\n",(string *)&local_1c0);
            std::__cxx11::string::~string((string *)&local_1c0);
            piVar8 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar10 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_finish;
          }
        }
      }
      piVar14 = (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      piVar3 = (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if (piVar14 != piVar3) {
        uVar12 = uVar12 + ((long)piVar3 - (long)piVar14 >> 2);
        for (; piVar14 != piVar3; piVar14 = piVar14 + 1) {
          if (*piVar14 < 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_190,"~0u,",(allocator<char> *)(local_190 + 0x20));
          }
          else {
            absl::lts_20240722::AlphaNum::AlphaNum(&local_1f8,*piVar14);
            local_1c0 = absl::lts_20240722::NullSafeStringView(",  // inlined_string_index");
            absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_190,&local_1f8);
          }
          Formatter::operator()
                    ((Formatter *)local_220,"$1$\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190)
          ;
          std::__cxx11::string::~string((string *)local_190);
        }
      }
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)(local_220 + 8));
      absl::lts_20240722::
      Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
      ::~Cleanup(&local_140);
      absl::lts_20240722::
      Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
      ::~Cleanup(&local_128);
      pVar15.second = uVar9;
      pVar15.first = uVar12;
      return pVar15;
    }
    this_01 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                        ((Iterator *)(local_190 + 0x20));
    if ((*(char *)(*(long *)(this_01 + 0x38) + 0x8c) == '\0') &&
       (pOVar5 = FieldDescriptor::real_containing_oneof(this_01), pOVar5 == (OneofDescriptor *)0x0))
    {
      bVar4 = ShouldSplit(this_01,opts);
      local_1c8 = "";
      split = 0x32;
      if (bVar4) {
        local_1c8 = "::Impl_::Split";
      }
      bVar4 = ShouldSplit(this_01,opts);
      if (bVar4) {
        FieldName_abi_cxx11_(&local_160,(cpp *)this_01,field);
        local_1f8.piece_._M_len = local_160._M_string_length;
        local_1f8.piece_._M_str = local_160._M_dataplus._M_p;
        local_1c0 = absl::lts_20240722::NullSafeStringView("_");
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_190,&local_1f8);
      }
      else {
        FieldMemberName_abi_cxx11_
                  ((string *)local_190,(cpp *)this_01,(FieldDescriptor *)0x0,(bool)split);
      }
      Formatter::operator()
                ((Formatter *)local_220,"PROTOBUF_FIELD_OFFSET($classtype$$1$, $2$)",&local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190);
      std::__cxx11::string::~string((string *)local_190);
      if (bVar4) {
        std::__cxx11::string::~string((string *)&local_160);
      }
    }
    else {
      Formatter::operator()<>((Formatter *)local_220,"::_pbi::kInvalidFieldOffsetTag");
    }
    bVar4 = ShouldSplit(this_01,opts);
    if (bVar4) {
      Formatter::operator()<>((Formatter *)local_220," | ::_pbi::kSplitFieldOffsetMask /*split*/");
    }
    bVar4 = IsEagerlyVerifiedLazy(this_01,opts,this->scc_analyzer_);
    pcVar13 = " | 0x1u /*eagerly verified lazy*/";
    if (bVar4) {
LAB_001cabc5:
      Formatter::operator()<>((Formatter *)local_220,pcVar13);
    }
    else {
      bVar4 = IsStringInlined(this_01,opts);
      pcVar13 = " | 0x1u /*inlined*/";
      if (bVar4) goto LAB_001cabc5;
    }
    Formatter::operator()<>((Formatter *)local_220,",\n");
    local_190._32_4_ = local_190._32_4_ + 1;
  } while( true );
}

Assistant:

std::pair<size_t, size_t> MessageGenerator::GenerateOffsets(io::Printer* p) {
  auto v = p->WithVars(ClassVars(descriptor_, options_));
  auto t = p->WithVars(MakeTrackerCalls(descriptor_, options_));
  Formatter format(p);

  if (!has_bit_indices_.empty() || IsMapEntryMessage(descriptor_)) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $has_bits$),\n");
  } else {
    format("~0u,  // no _has_bits_\n");
  }
  format("PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_),\n");
  if (descriptor_->extension_range_count() > 0) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $extensions$),\n");
  } else {
    format("~0u,  // no _extensions_\n");
  }
  if (descriptor_->real_oneof_decl_count() > 0) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $oneof_case$[0]),\n");
  } else {
    format("~0u,  // no _oneof_case_\n");
  }
  if (num_weak_fields_ > 0) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $weak_field_map$),\n");
  } else {
    format("~0u,  // no _weak_field_map_\n");
  }
  if (!inlined_string_indices_.empty()) {
    format(
        "PROTOBUF_FIELD_OFFSET($classtype$, "
        "$inlined_string_donated_array$),\n");
  } else {
    format("~0u,  // no _inlined_string_donated_\n");
  }
  if (ShouldSplit(descriptor_, options_)) {
    format(
        "PROTOBUF_FIELD_OFFSET($classtype$, $split$),\n"
        "sizeof($classtype$::Impl_::Split),\n");
  } else {
    format(
        "~0u,  // no _split_\n"
        "~0u,  // no sizeof(Split)\n");
  }
  const int kNumGenericOffsets = 8;  // the number of fixed offsets above
  const size_t offsets = kNumGenericOffsets + descriptor_->field_count() +
                         descriptor_->real_oneof_decl_count();
  size_t entries = offsets;
  for (auto field : FieldRange(descriptor_)) {
    // TODO: We should not have an entry in the offset table for fields
    // that do not use them.
    if (field->options().weak() || field->real_containing_oneof()) {
      // Mark the field to prevent unintentional access through reflection.
      // Don't use the top bit because that is for unused fields.
      format("::_pbi::kInvalidFieldOffsetTag");
    } else {
      format("PROTOBUF_FIELD_OFFSET($classtype$$1$, $2$)",
             ShouldSplit(field, options_) ? "::Impl_::Split" : "",
             ShouldSplit(field, options_)
                 ? absl::StrCat(FieldName(field), "_")
                 : FieldMemberName(field, /*split=*/false));
    }

    // Some information about a field is in the pdproto profile. The profile is
    // only available at compile time. So we embed such information in the
    // offset of the field, so that the information is available when
    // reflectively accessing the field at run time.
    //
    // We embed whether the field is cold to the MSB of the offset, and whether
    // the field is eagerly verified lazy or inlined string to the LSB of the
    // offset.

    if (ShouldSplit(field, options_)) {
      format(" | ::_pbi::kSplitFieldOffsetMask /*split*/");
    }
    if (IsEagerlyVerifiedLazy(field, options_, scc_analyzer_)) {
      format(" | 0x1u /*eagerly verified lazy*/");
    } else if (IsStringInlined(field, options_)) {
      format(" | 0x1u /*inlined*/");
    }
    format(",\n");
  }

  int count = 0;
  for (auto oneof : OneOfRange(descriptor_)) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, _impl_.$1$_),\n", oneof->name());
    count++;
  }
  ABSL_CHECK_EQ(count, descriptor_->real_oneof_decl_count());

  if (IsMapEntryMessage(descriptor_)) {
    entries += 2;
    format(
        "0,\n"
        "1,\n");
  } else if (!has_bit_indices_.empty()) {
    entries += has_bit_indices_.size();
    for (size_t i = 0; i < has_bit_indices_.size(); ++i) {
      const std::string index =
          has_bit_indices_[i] >= 0 ? absl::StrCat(has_bit_indices_[i]) : "~0u";
      format("$1$,\n", index);
    }
  }
  if (!inlined_string_indices_.empty()) {
    entries += inlined_string_indices_.size();
    for (int inlined_string_index : inlined_string_indices_) {
      const std::string index =
          inlined_string_index >= 0
              ? absl::StrCat(inlined_string_index, ",  // inlined_string_index")
              : "~0u,";
      format("$1$\n", index);
    }
  }

  return std::make_pair(entries, offsets);
}